

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_in_parser.h
# Opt level: O0

bool parse::parse_column<float>(string *str,vector<float,_std::allocator<float>_> *vec)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  size_type sVar4;
  reference str_00;
  size_type sVar5;
  float local_10c;
  iterator iStack_108;
  float tmp;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  const_iterator iter;
  value_type local_d0;
  long local_b0;
  size_type end;
  size_type start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  int local_80 [2];
  int num;
  string local_70 [8];
  string arr_str;
  string num_str;
  size_type pos;
  bool ret;
  vector<float,_std::allocator<float>_> *vec_local;
  string *str_local;
  
  lVar3 = std::__cxx11::string::find((char *)str,0x14d7f0);
  if (lVar3 == -1) {
    str_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&arr_str.field_2 + 8),(ulong)str);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_70,(ulong)str);
    bVar2 = parse_column((string *)((long)&arr_str.field_2 + 8),local_80);
    if (bVar2 == 0xffffffff) {
      str_local._7_1_ = false;
      elements.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&start);
      end = 0;
      local_b0 = std::__cxx11::string::find((char)local_70,0x2c);
      while (sVar1 = end, local_b0 != -1) {
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&start,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        end = local_b0 + 1;
        local_b0 = std::__cxx11::string::find((char)local_70,0x2c);
      }
      sVar4 = std::__cxx11::string::length();
      if (sVar1 != sVar4) {
        std::__cxx11::string::substr((ulong)&iter,(ulong)local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&start,(value_type *)&iter);
        std::__cxx11::string::~string((string *)&iter);
      }
      local_100._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&start);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_f8,&local_100);
      while( true ) {
        iStack_108 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&start);
        bVar2 = __gnu_cxx::operator!=(&local_f8,&stack0xfffffffffffffef8);
        if (!bVar2) break;
        str_00 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_f8);
        parse_column(str_00,&local_10c);
        std::vector<float,_std::allocator<float>_>::push_back(vec,&local_10c);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_f8,0);
      }
      sVar5 = std::vector<float,_std::allocator<float>_>::size(vec);
      str_local._7_1_ = (long)local_80[0] == sVar5;
      elements.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&start);
    }
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)(arr_str.field_2._M_local_buf + 8));
  }
  return str_local._7_1_;
}

Assistant:

bool parse_column(const std::string& str, std::vector<T> *vec){
    bool ret = true;
    std::string::size_type pos = str.find(":");
    if (pos == std::string::npos){
        ret = false;
        return ret;
    }
    std::string num_str = str.substr(0, pos-0);
    std::string arr_str = str.substr(pos+1, str.length()-pos-1);
    int num;
    if (parse_column(num_str, &num) == -1){
        ret = false;
        return ret;
    };
    std::vector<std::string> elements;
    std::string::size_type start = 0;
    std::string::size_type end = arr_str.find(',');
    while (std::string::npos != end){
        elements.push_back(arr_str.substr(start, end - start));
        start = end + 1;
        end = arr_str.find(',', start);
    }
    if (start != arr_str.length()){
        elements.push_back(arr_str.substr(start));
    }
    for (std::vector<std::string>::const_iterator iter = elements.begin();
        iter != elements.end(); iter++){
        T tmp;
        parse_column(*iter, &tmp);
        vec->push_back(tmp);
    }
    if (num != vec->size()){
        ret = false;
        return ret;
    }
    return ret;
}